

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

TypeCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::pool_ref<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,Type *args_1,pool_ref<soul::AST::Expression> *args_2)

{
  size_t sVar1;
  DestructorFn *pDVar2;
  Structure *pSVar3;
  Expression *pEVar4;
  SourceCodeText *pSVar5;
  Scope *pSVar6;
  PoolItem *pPVar7;
  
  pPVar7 = allocateSpaceForObject(this,0x50);
  sVar1 = *(size_t *)args_1;
  pDVar2 = *(DestructorFn **)&args_1->boundingSize;
  pSVar3 = (args_1->structure).object;
  (args_1->structure).object = (Structure *)0x0;
  pEVar4 = args_2->object;
  *(undefined4 *)&pPVar7->field_0x18 = 0x1b;
  pSVar5 = (args->location).sourceCode.object;
  pPVar7[1].size = (size_t)pSVar5;
  if (pSVar5 != (SourceCodeText *)0x0) {
    (pSVar5->super_RefCountedObject).refCount = (pSVar5->super_RefCountedObject).refCount + 1;
  }
  pSVar6 = args->parentScope;
  pPVar7[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar7[1].item = pSVar6;
  *(undefined4 *)&pPVar7[1].field_0x18 = 0;
  pPVar7->item = &PTR__TypeCast_002f7e30;
  pPVar7[2].size = sVar1;
  pPVar7[2].destructor = pDVar2;
  pPVar7[2].item = pSVar3;
  *(Expression **)&pPVar7[2].field_0x18 = pEVar4;
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
  pPVar7->destructor =
       allocate<soul::AST::TypeCast,_soul::AST::Context_&,_soul::Type,_soul::pool_ref<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeCast *)&pPVar7->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }